

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Descriptor * __thiscall google::protobuf::MethodDescriptor::input_type(MethodDescriptor *this)

{
  ServiceDescriptor *service;
  Descriptor *pDVar1;
  MethodDescriptor *this_local;
  
  service = MethodDescriptor::service(this);
  pDVar1 = internal::LazyDescriptor::Get(&this->input_type_,service);
  return pDVar1;
}

Assistant:

const Descriptor* MethodDescriptor::input_type() const {
  return input_type_.Get(service());
}